

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O3

void __thiscall HttpSession::do_read(HttpSession *this)

{
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  bind_front_wrapper<void_(HttpSession::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<HttpSession>_>
  local_c8;
  undefined1 local_a8 [16];
  element_type *peStack_98;
  element_type *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_88;
  type local_80;
  dummy_u dStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  peStack_98 = (element_type *)(local_a8 + 8);
  local_a8._8_8_ = (node_ptr)0x0;
  _Stack_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bStack_48._M_string_length = 0;
  bStack_48.field_2._8_8_ = 0;
  local_a8._0_8_ = 0;
  local_80 = (type)&local_80;
  dStack_78._8_8_ = 0;
  dStack_78._16_8_ = (char *)0x0;
  dStack_78._24_8_ = 0;
  dStack_78._32_8_ = (char *)0x0;
  dStack_78._40_8_ = 0xb;
  bStack_48.field_2._M_allocated_capacity = 0;
  local_90 = peStack_98;
  dStack_78.aligner_ = local_80;
  bStack_48._M_dataplus._M_p = (pointer)&bStack_48.field_2;
  boost::beast::http::basic_fields<std::allocator<char>_>::operator=
            ((basic_fields<std::allocator<char>_> *)&this->req,
             (basic_fields<std::allocator<char>_> *)local_a8);
  (this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.version_
       = dStack_78._40_4_;
  (this->req).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.method_ =
       dStack_78._44_4_;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(this->req).
              super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
              .value_,&bStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bStack_48._M_dataplus._M_p != &bStack_48.field_2) {
    operator_delete(bStack_48._M_dataplus._M_p,bStack_48.field_2._M_allocated_capacity + 1);
  }
  boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
            ((basic_fields<std::allocator<char>_> *)local_a8);
  boost::beast::
  basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
  ::expires_after(&this->stream,(duration)0x6fc23ac00);
  std::__shared_ptr<HttpSession,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HttpSession,void>
            ((__shared_ptr<HttpSession,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
             (__weak_ptr<HttpSession,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_c8.h_ = (offset_in_HttpSession_to_subr)on_read;
  local_c8._8_8_ = 0;
  local_c8.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<HttpSession>_>
  .super_tuple_element_impl<0UL,_std::shared_ptr<HttpSession>_>.t.
  super___shared_ptr<HttpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_d8;
  local_c8.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<HttpSession>_>
  .super_tuple_element_impl<0UL,_std::shared_ptr<HttpSession>_>.t.
  super___shared_ptr<HttpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Stack_d0;
  local_d8 = (element_type *)0x0;
  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::beast::http::detail::
  read_msg_op<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,boost::beast::basic_flat_buffer<std::allocator<char>>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,boost::beast::detail::bind_front_wrapper<void(HttpSession::*)(boost::system::error_code,unsigned_long),std::shared_ptr<HttpSession>>>
  ::
  read_msg_op<boost::beast::detail::bind_front_wrapper<void(HttpSession::*)(boost::system::error_code,unsigned_long),std::shared_ptr<HttpSession>>>
            ((read_msg_op<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,boost::beast::basic_flat_buffer<std::allocator<char>>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,std::allocator<char>,boost::beast::detail::bind_front_wrapper<void(HttpSession::*)(boost::system::error_code,unsigned_long),std::shared_ptr<HttpSession>>>
              *)local_a8,&local_c8,&this->stream,&this->buffer,&this->req);
  boost::beast::
  stable_async_base<boost::beast::detail::bind_front_wrapper<void_(HttpSession::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<HttpSession>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_std::allocator<void>_>
  ::~stable_async_base
            ((stable_async_base<boost::beast::detail::bind_front_wrapper<void_(HttpSession::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<HttpSession>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_std::allocator<void>_>
              *)local_a8);
  if (local_c8.args_.
      super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<HttpSession>_>
      .super_tuple_element_impl<0UL,_std::shared_ptr<HttpSession>_>.t.
      super___shared_ptr<HttpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.args_.
               super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<HttpSession>_>
               .super_tuple_element_impl<0UL,_std::shared_ptr<HttpSession>_>.t.
               super___shared_ptr<HttpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
  }
  return;
}

Assistant:

explicit WebSocketsession(tcp::socket&& socket): ws(std::move(socket)) {}